

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

void __thiscall
cplus::utils::Set<cplus::lang::String>::TreeNode::forEach
          (TreeNode *this,function<void_(cplus::utils::Set<cplus::lang::String>::TreeNode_*)> *func)

{
  bool bVar1;
  TreeNode *state;
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> taskQueue;
  TreeNode *local_80;
  TreeNode *local_78;
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> local_70;
  
  local_80 = this;
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::ArrayStack(&local_70);
  do {
    std::function<void_(cplus::utils::Set<cplus::lang::String>::TreeNode_*)>::operator()(func,this);
    if (local_80->left != (TreeNode *)0x0) {
      local_78 = local_80->left;
      ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::push(&local_70,&local_78);
    }
    if (local_80->right != (TreeNode *)0x0) {
      local_78 = local_80->right;
      ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::push(&local_70,&local_78);
    }
    bVar1 = ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::pop(&local_70,&local_80)
    ;
    this = local_80;
  } while (bVar1 && local_80 != (TreeNode *)0x0);
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::~ArrayStack(&local_70);
  return;
}

Assistant:

void forEach(std::function<void(TreeNode *)> func) {
					TreeNode *state = this;
					ArrayStack<TreeNode *> taskQueue;
					while (state != nullptr) {
						func(state);
						if (state->getLeft() != nullptr)taskQueue.push(state->getLeft());
						if (state->getRight() != nullptr)taskQueue.push(state->getRight());
						if (!taskQueue.pop(state))break;
					}
				}